

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O0

void __thiscall Movegen::generate<(Movetype)14,(Piece)6>(Movegen *this)

{
  bool bVar1;
  Movegen *this_local;
  
  if (this->check_target == 0) {
    generate<(Movetype)16,(Piece)0>(this);
    generate<(Movetype)15,(Piece)0>(this);
    generate<(Movetype)14,(Piece)1>(this);
    generate<(Movetype)14,(Piece)2>(this);
    generate<(Movetype)14,(Piece)3>(this);
    generate<(Movetype)14,(Piece)4>(this);
    generate<(Movetype)11,(Piece)0>(this);
    generate<(Movetype)10,(Piece)0>(this);
    generate<(Movetype)10,(Piece)5>(this);
    generate<(Movetype)13,(Piece)5>(this);
    generate<(Movetype)11,(Piece)5>(this);
  }
  else if ((this->check_target == 0) || (this->evasion_target != 0)) {
    if ((this->check_target != 0) && (this->evasion_target != 0)) {
      bVar1 = bits::more_than_one(&this->check_target);
      if (bVar1) {
        generate<(Movetype)11,(Piece)5>(this);
        generate<(Movetype)10,(Piece)5>(this);
      }
      else {
        generate<(Movetype)16,(Piece)0>(this);
        generate<(Movetype)11,(Piece)5>(this);
        generate<(Movetype)11,(Piece)0>(this);
        generate<(Movetype)14,(Piece)1>(this);
        generate<(Movetype)14,(Piece)2>(this);
        generate<(Movetype)14,(Piece)3>(this);
        generate<(Movetype)14,(Piece)4>(this);
        generate<(Movetype)15,(Piece)0>(this);
        generate<(Movetype)10,(Piece)5>(this);
        generate<(Movetype)10,(Piece)0>(this);
      }
    }
  }
  else {
    bVar1 = bits::more_than_one(&this->check_target);
    if (bVar1) {
      generate<(Movetype)11,(Piece)5>(this);
      generate<(Movetype)10,(Piece)5>(this);
    }
    else {
      generate<(Movetype)16,(Piece)0>(this);
      generate<(Movetype)11,(Piece)5>(this);
      generate<(Movetype)11,(Piece)0>(this);
      generate<(Movetype)11,(Piece)1>(this);
      generate<(Movetype)11,(Piece)2>(this);
      generate<(Movetype)11,(Piece)3>(this);
      generate<(Movetype)11,(Piece)4>(this);
      generate<(Movetype)10,(Piece)5>(this);
    }
  }
  return;
}

Assistant:

inline void Movegen::generate<pseudo_legal, pieces>() {
	// todo: order move generation by game phase
	// data-driven approach for this?
	if (check_target == 0ULL) { // all moves
		generate<capture_promotion, pawn>();
		generate<promotion, pawn>();
		generate<pseudo_legal, knight>();
		generate<pseudo_legal, bishop>();
		generate<pseudo_legal, rook>();
		generate<pseudo_legal, queen>();
		generate<capture, pawn>();
		generate<quiet, pawn>();
		generate<quiet, king>();
		generate<castles, king>();
		generate<capture, king>();
	}
	else if (check_target != 0ULL && evasion_target == 0ULL) {
		if (!bits::more_than_one(check_target)) {
			generate<capture_promotion, pawn>();
			generate<capture, king>();
			generate<capture, pawn>();
			generate<capture, knight>();
			generate<capture, bishop>();
			generate<capture, rook>();
			generate<capture, queen>();
			generate<quiet, king>();
		}
		else {
			generate<capture, king>();
			generate<quiet, king>(); // more than one checker
		}
	}
	else if (check_target != 0ULL && evasion_target != 0ULL) {
		if (!bits::more_than_one(check_target)) {
			// capture moves
			generate<capture_promotion, pawn>();
			generate<capture, king>();
			generate<capture, pawn>();
			generate<pseudo_legal, knight>();
			generate<pseudo_legal, bishop>();
			generate<pseudo_legal, rook>();
			generate<pseudo_legal, queen>();

			// blocking moves
			generate<promotion, pawn>();
			generate<quiet, king>();
			generate<quiet, pawn>();
		}
		else {
			generate<capture, king>();
			generate<quiet, king>(); // more than one checker
		}
	}
}